

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::Initialize(cmCTest *this,char *binary_dir,cmCTestStartCommand *command)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  char *pcVar5;
  pointer pPVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined8 in_stack_ffffffffffffc138;
  long lVar9;
  undefined4 uVar10;
  byte local_3d01;
  string local_3c50 [32];
  string local_3c30;
  undefined1 local_3c10 [8];
  ostringstream cmCTestLog_msg_17;
  string local_3a98 [32];
  undefined1 local_3a78 [8];
  ostringstream cmCTestLog_msg_16;
  string local_3900 [32];
  undefined1 local_38e0 [8];
  ostringstream cmCTestLog_msg_15;
  string local_3768 [32];
  undefined1 local_3748 [8];
  ostringstream cmCTestLog_msg_14;
  string local_35d0 [32];
  undefined1 local_35b0 [8];
  ostringstream cmCTestLog_msg_13;
  int local_3434;
  undefined1 local_3430 [4];
  int model_1;
  string modelStr;
  string group_1;
  string local_33d0;
  undefined1 local_33b0 [8];
  ostringstream cmCTestLog_msg_12;
  string local_3238;
  undefined1 local_3218 [8];
  ofstream ofs;
  char datestring [100];
  allocator<char> local_2fa9;
  string local_2fa8;
  string local_2f88;
  string local_2f68 [32];
  undefined1 local_2f48 [8];
  ostringstream cmCTestLog_msg_11;
  string local_2dd0 [32];
  string local_2db0;
  undefined1 local_2d90 [8];
  ostringstream cmCTestLog_msg_10;
  undefined1 local_2c18 [8];
  string model;
  string group;
  undefined4 local_2bd0;
  int min;
  int hour;
  int day;
  int mon;
  int year;
  tm *lctime;
  time_t tctime;
  string tag;
  ifstream tfin;
  undefined1 local_2988 [8];
  string tagfile;
  string local_2960 [7];
  bool createNewTag;
  undefined1 local_2940 [8];
  ostringstream cmCTestLog_msg_9;
  Status local_27c8;
  string local_27c0 [32];
  undefined1 local_27a0 [8];
  ostringstream cmCTestLog_msg_8;
  undefined1 local_2628 [8];
  string testingDir;
  string local_2600 [32];
  undefined1 local_25e0 [8];
  ostringstream cmCTestLog_msg_7;
  cmStateSnapshot local_2468;
  undefined1 local_2450 [8];
  cmMakefile mf;
  cmGlobalGenerator gg;
  allocator<char> local_1549;
  string local_1548;
  allocator<char> local_1521;
  string local_1520;
  undefined1 local_1500 [8];
  cmake cm;
  ostringstream local_c68 [8];
  ostringstream cmCTestLog_msg_6;
  string local_af0 [32];
  ostringstream local_ad0 [8];
  ostringstream cmCTestLog_msg_5;
  allocator<char> local_951;
  string local_950;
  string local_930;
  string local_910 [32];
  ostringstream local_8f0 [8];
  ostringstream cmCTestLog_msg_4;
  string local_778 [39];
  allocator<char> local_751;
  string local_750;
  string local_730;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  string local_6c8;
  ostringstream local_6a8 [8];
  ostringstream cmCTestLog_msg_3;
  string local_530 [32];
  ostringstream local_510 [8];
  ostringstream cmCTestLog_msg_2;
  string local_398 [32];
  ostringstream local_378 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream cmCTestLog_msg;
  bool local_29;
  bool quiet;
  cmCTestStartCommand *command_local;
  char *binary_dir_local;
  cmCTest *this_local;
  
  uVar10 = (undefined4)((ulong)in_stack_ffffffffffffc138 >> 0x20);
  local_29 = false;
  if ((command != (cmCTestStartCommand *)0x0) &&
     (bVar1 = cmCTestStartCommand::ShouldBeQuiet(command), bVar1)) {
    local_29 = true;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar3 = std::operator<<((ostream *)local_1a8,"Here: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,0x1a4);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x1a4,pcVar5,local_29);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  if ((pPVar6->InteractiveDebugMode & 1U) == 0) {
    BlockTestErrorDiagnostics(this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"CTEST_INTERACTIVE_DEBUG_MODE=1",&local_1f9);
    cmsys::SystemTools::PutEnv(&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
  }
  pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::__cxx11::string::operator=((string *)&pPVar6->BinaryDir,binary_dir);
  pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  cmsys::SystemTools::ConvertToUnixSlashes(&pPVar6->BinaryDir);
  UpdateCTestConfiguration(this);
  std::__cxx11::ostringstream::ostringstream(local_378);
  poVar3 = std::operator<<((ostream *)local_378,"Here: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,0x1b0);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x1b0,pcVar5,local_29);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::ostringstream::~ostringstream(local_378);
  pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  if ((pPVar6->ProduceXML & 1U) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_510);
    poVar3 = std::operator<<((ostream *)local_510,"Here: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,0x1b2);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x1b2,pcVar5,local_29);
    std::__cxx11::string::~string(local_530);
    std::__cxx11::ostringstream::~ostringstream(local_510);
    std::__cxx11::ostringstream::ostringstream(local_6a8);
    poVar3 = std::operator<<((ostream *)local_6a8,"   Site: ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"Site",&local_6e9);
    GetCTestConfiguration(&local_6c8,this,&local_6e8);
    poVar3 = std::operator<<(poVar3,(string *)&local_6c8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"   Build name: ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"BuildName",&local_751);
    GetCTestConfiguration(&local_730,this,&local_750);
    SafeBuildIdField(&local_710,&local_730);
    poVar3 = std::operator<<(poVar3,(string *)&local_710);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_710);
    std::__cxx11::string::~string((string *)&local_730);
    std::__cxx11::string::~string((string *)&local_750);
    std::allocator<char>::~allocator(&local_751);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator(&local_6e9);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x1ba,pcVar5,local_29);
    std::__cxx11::string::~string(local_778);
    std::__cxx11::ostringstream::~ostringstream(local_6a8);
    std::__cxx11::ostringstream::ostringstream(local_8f0);
    poVar3 = std::operator<<((ostream *)local_8f0,"Produce XML is on");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x1bb,pcVar5,local_29);
    std::__cxx11::string::~string(local_910);
    std::__cxx11::ostringstream::~ostringstream(local_8f0);
    pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    local_3d01 = 0;
    if (pPVar6->TestModel == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_950,"NightlyStartTime",&local_951);
      GetCTestConfiguration(&local_930,this,&local_950);
      local_3d01 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_930);
      std::__cxx11::string::~string((string *)&local_950);
      std::allocator<char>::~allocator(&local_951);
    }
    if ((local_3d01 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_ad0);
      poVar3 = std::operator<<((ostream *)local_ad0,
                               "WARNING: No nightly start time found please set in CTestConfig.cmake or DartConfig.cmake"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x1c3,pcVar5,local_29);
      std::__cxx11::string::~string(local_af0);
      std::__cxx11::ostringstream::~ostringstream(local_ad0);
      std::__cxx11::ostringstream::ostringstream(local_c68);
      poVar3 = std::operator<<((ostream *)local_c68,"Here: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,0x1c4);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x1c5,pcVar5,local_29);
      std::__cxx11::string::~string((string *)&cm.ProfilingOutput);
      std::__cxx11::ostringstream::~ostringstream(local_c68);
      return 0;
    }
  }
  cmake::cmake((cmake *)local_1500,RoleScript,CTest,Normal);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1520,"",&local_1521);
  cmake::SetHomeDirectory((cmake *)local_1500,&local_1520);
  std::__cxx11::string::~string((string *)&local_1520);
  std::allocator<char>::~allocator(&local_1521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1548,"",&local_1549);
  cmake::SetHomeOutputDirectory((cmake *)local_1500,&local_1548);
  std::__cxx11::string::~string((string *)&local_1548);
  std::allocator<char>::~allocator(&local_1549);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&gg.InstallTargetEnabled,(cmake *)local_1500);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmake *)local_1500);
  cmake::GetCurrentSnapshot(&local_2468,(cmake *)local_1500);
  cmMakefile::cmMakefile
            ((cmMakefile *)local_2450,(cmGlobalGenerator *)&mf.IsSourceFileTryCompile,&local_2468);
  pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  iVar2 = ReadCustomConfigurationFileTree(this,&pPVar6->BinaryDir,(cmMakefile *)local_2450);
  if (iVar2 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_25e0);
    poVar3 = std::operator<<((ostream *)local_25e0,"Cannot find custom configuration file tree");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x1d3,pcVar5,local_29);
    std::__cxx11::string::~string(local_2600);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_25e0);
    this_local._4_4_ = 0;
    testingDir.field_2._12_4_ = 1;
    goto LAB_001b93bc;
  }
  pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  if ((pPVar6->ProduceXML & 1U) != 0) {
    pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2628,
                   &pPVar6->BinaryDir,"/Testing");
    bVar1 = cmsys::SystemTools::FileExists((string *)local_2628);
    if (bVar1) {
      bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_2628);
      if (bVar1) goto LAB_001b7f7e;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_27a0);
      poVar3 = std::operator<<((ostream *)local_27a0,"File ");
      poVar3 = std::operator<<(poVar3,(string *)local_2628);
      poVar3 = std::operator<<(poVar3," is in the place of the testing directory");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x1e0,pcVar5,false);
      std::__cxx11::string::~string(local_27c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_27a0);
      this_local._4_4_ = 0;
      testingDir.field_2._12_4_ = 1;
    }
    else {
      local_27c8 = cmsys::SystemTools::MakeDirectory((string *)local_2628,(mode_t *)0x0);
      bVar1 = cmsys::Status::operator_cast_to_bool(&local_27c8);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_001b7f7e:
        tagfile.field_2._M_local_buf[0xf] = '\x01';
        if (command != (cmCTestStartCommand *)0x0) {
          tagfile.field_2._M_local_buf[0xf] = cmCTestStartCommand::ShouldCreateNewTag(command);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2988,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2628,"/TAG");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        std::ifstream::ifstream((void *)((long)&tag.field_2 + 8),pcVar5,_S_in);
        std::__cxx11::string::string((string *)&tctime);
        if ((tagfile.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::__cxx11::string::string((string *)(modelStr.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_3430);
          local_3434 = -1;
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)((long)&tag.field_2 + *(long *)(tag.field_2._8_8_ + -0x18) + 8))
          ;
          if (bVar1) {
            cmsys::SystemTools::GetLineFromStream
                      ((istream *)(tag.field_2._M_local_buf + 8),(string *)&tctime,(bool *)0x0,
                       0xffffffffffffffff);
            cmsys::SystemTools::GetLineFromStream
                      ((istream *)(tag.field_2._M_local_buf + 8),
                       (string *)((long)&modelStr.field_2 + 8),(bool *)0x0,0xffffffffffffffff);
            bVar1 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)(tag.field_2._M_local_buf + 8),(string *)local_3430,
                               (bool *)0x0,0xffffffffffffffff);
            if (bVar1) {
              local_3434 = GetTestModelFromString((string *)local_3430);
            }
            std::ifstream::close();
          }
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            if (pPVar6->TestModel == -1) {
              if (local_3434 == -1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3748);
                poVar3 = std::operator<<((ostream *)local_3748,
                                         "TAG file does not contain model and no model specified in start command"
                                        );
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                Log(this,7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                    ,0x259,pcVar5,false);
                std::__cxx11::string::~string(local_3768);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3748);
                this_local._4_4_ = 0;
                testingDir.field_2._12_4_ = 1;
                goto LAB_001b926b;
              }
              SetTestModel(this,local_3434);
            }
            pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            if (((local_3434 != pPVar6->TestModel) && (local_3434 != -1)) &&
               (pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                         operator->(&this->Impl), pPVar6->TestModel != -1)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_38e0);
              poVar3 = std::operator<<((ostream *)local_38e0,
                                       "Model given in TAG does not match model given in ctest_start()"
                                      );
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              Log(this,6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                  ,0x266,pcVar5,local_29);
              std::__cxx11::string::~string(local_3900);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_38e0);
            }
            std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                      (&this->Impl);
            uVar8 = std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                       operator->(&this->Impl);
              bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&modelStr.field_2 + 8),&pPVar6->SpecificGroup);
              if (!bVar1) goto LAB_001b911f;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a78);
              poVar3 = std::operator<<((ostream *)local_3a78,
                                       "Group given in TAG does not match group given in ctest_start()"
                                      );
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              Log(this,6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                  ,0x26f,pcVar5,local_29);
              std::__cxx11::string::~string(local_3a98);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a78);
            }
            else {
LAB_001b911f:
              pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                       operator->(&this->Impl);
              std::__cxx11::string::operator=
                        ((string *)&pPVar6->SpecificGroup,
                         (string *)(modelStr.field_2._M_local_buf + 8));
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c10);
            poVar3 = std::operator<<((ostream *)local_3c10,"  Use existing tag: ");
            poVar3 = std::operator<<(poVar3,(string *)&tctime);
            poVar3 = std::operator<<(poVar3," - ");
            GetTestModelString_abi_cxx11_(&local_3c30,this);
            poVar3 = std::operator<<(poVar3,(string *)&local_3c30);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_3c30);
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            Log(this,1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                ,0x278,pcVar5,local_29);
            std::__cxx11::string::~string(local_3c50);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c10);
            testingDir.field_2._12_4_ = 0;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_35b0);
            poVar3 = std::operator<<((ostream *)local_35b0,"Cannot read existing TAG file in ");
            poVar3 = std::operator<<(poVar3,(string *)local_2628);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            Log(this,7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                ,0x250,pcVar5,false);
            std::__cxx11::string::~string(local_35d0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_35b0);
            this_local._4_4_ = 0;
            testingDir.field_2._12_4_ = 1;
          }
LAB_001b926b:
          std::__cxx11::string::~string((string *)local_3430);
          std::__cxx11::string::~string((string *)(modelStr.field_2._M_local_buf + 8));
          if (testingDir.field_2._12_4_ == 0) goto LAB_001b930d;
        }
        else {
          lctime = (tm *)time((time_t *)0x0);
          pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          if ((pPVar6->TomorrowTag & 1U) != 0) {
            lctime = (tm *)&lctime[0x606].tm_zone;
          }
          _mon = (tm *)gmtime((time_t *)&lctime);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)((long)&tag.field_2 + *(long *)(tag.field_2._8_8_ + -0x18) + 8))
          ;
          if ((bVar1) &&
             (bVar1 = cmsys::SystemTools::GetLineFromStream
                                ((istream *)(tag.field_2._M_local_buf + 8),(string *)&tctime,
                                 (bool *)0x0,0xffffffffffffffff), bVar1)) {
            day = 0;
            hour = 0;
            min = 0;
            local_2bd0 = 0;
            group.field_2._12_4_ = 0;
            uVar7 = std::__cxx11::string::c_str();
            lVar9 = (long)&group.field_2._M_allocated_capacity + 0xc;
            __isoc99_sscanf(uVar7,"%04d%02d%02d-%02d%02d",&day,&hour,&min,&local_2bd0,lVar9);
            uVar10 = (undefined4)((ulong)lVar9 >> 0x20);
            if ((day != ((tm *)_mon)->tm_year + 0x76c) ||
               ((hour != ((tm *)_mon)->tm_mon + 1 || (min != ((tm *)_mon)->tm_mday)))) {
              std::__cxx11::string::clear();
            }
            std::__cxx11::string::string((string *)(model.field_2._M_local_buf + 8));
            bVar1 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)(tag.field_2._M_local_buf + 8),
                               (string *)(model.field_2._M_local_buf + 8),(bool *)0x0,
                               0xffffffffffffffff);
            if (bVar1) {
              pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                       operator->(&this->Impl);
              bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar6->Parts);
              if ((!bVar1) && (command == (cmCTestStartCommand *)0x0)) {
                pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                         operator->(&this->Impl);
                std::__cxx11::string::operator=
                          ((string *)&pPVar6->SpecificGroup,
                           (string *)(model.field_2._M_local_buf + 8));
              }
            }
            std::__cxx11::string::string((string *)local_2c18);
            bVar1 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)(tag.field_2._M_local_buf + 8),(string *)local_2c18,
                               (bool *)0x0,0xffffffffffffffff);
            if (bVar1) {
              pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                       operator->(&this->Impl);
              bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar6->Parts);
              if ((!bVar1) && (command == (cmCTestStartCommand *)0x0)) {
                iVar2 = GetTestModelFromString((string *)local_2c18);
                pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                         operator->(&this->Impl);
                pPVar6->TestModel = iVar2;
              }
            }
            std::ifstream::close();
            std::__cxx11::string::~string((string *)local_2c18);
            std::__cxx11::string::~string((string *)(model.field_2._M_local_buf + 8));
          }
          uVar8 = std::__cxx11::string::empty();
          if (((uVar8 & 1) == 0) && (command == (cmCTestStartCommand *)0x0)) {
            pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar6->Parts);
            if (!bVar1) goto LAB_001b930d;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d90);
          poVar3 = std::operator<<((ostream *)local_2d90,"TestModel: ");
          GetTestModelString_abi_cxx11_(&local_2db0,this);
          poVar3 = std::operator<<(poVar3,(string *)&local_2db0);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_2db0);
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          Log(this,0,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0x218,pcVar5,local_29);
          std::__cxx11::string::~string(local_2dd0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d90);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f48);
          poVar3 = std::operator<<((ostream *)local_2f48,"TestModel: ");
          pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          pvVar4 = (void *)std::ostream::operator<<(poVar3,pPVar6->TestModel);
          std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          Log(this,0,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0x21b,pcVar5,local_29);
          std::__cxx11::string::~string(local_2f68);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f48);
          pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          if (pPVar6->TestModel == 1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2fa8,"NightlyStartTime",&local_2fa9);
            GetCTestConfiguration(&local_2f88,this,&local_2fa8);
            pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            _mon = GetNightlyTime(this,&local_2f88,(bool)(pPVar6->TomorrowTag & 1));
            std::__cxx11::string::~string((string *)&local_2f88);
            std::__cxx11::string::~string((string *)&local_2fa8);
            std::allocator<char>::~allocator(&local_2fa9);
          }
          snprintf(&ofs.field_0x1f8,100,"%04d%02d%02d-%02d%02d",
                   (ulong)(((tm *)_mon)->tm_year + 0x76c),(ulong)(((tm *)_mon)->tm_mon + 1),
                   (ulong)(uint)((tm *)_mon)->tm_mday,CONCAT44(uVar10,((tm *)_mon)->tm_hour),
                   ((tm *)_mon)->tm_min);
          std::__cxx11::string::operator=((string *)&tctime,&ofs.field_0x1f8);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          std::ofstream::ofstream(local_3218,pcVar5,_S_out);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(local_3218 + (long)*(_func_int **)((long)local_3218 + -0x18)));
          if (bVar1) {
            poVar3 = std::operator<<((ostream *)local_3218,(string *)&tctime);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            GetTestModelString_abi_cxx11_(&local_3238,this);
            poVar3 = std::operator<<((ostream *)local_3218,(string *)&local_3238);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_3238);
            pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            iVar2 = pPVar6->TestModel;
            if (iVar2 == 0) {
              poVar3 = std::operator<<((ostream *)local_3218,"Experimental");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            }
            else if (iVar2 == 1) {
              poVar3 = std::operator<<((ostream *)local_3218,"Nightly");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            }
            else if (iVar2 == 2) {
              poVar3 = std::operator<<((ostream *)local_3218,"Continuous");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            }
          }
          std::ofstream::close();
          if (command == (cmCTestStartCommand *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_33b0);
            poVar3 = std::operator<<((ostream *)local_33b0,"Create new tag: ");
            poVar3 = std::operator<<(poVar3,(string *)&tctime);
            poVar3 = std::operator<<(poVar3," - ");
            GetTestModelString_abi_cxx11_(&local_33d0,this);
            poVar3 = std::operator<<(poVar3,(string *)&local_33d0);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_33d0);
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            Log(this,1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                ,0x23c,pcVar5,local_29);
            std::__cxx11::string::~string((string *)(group_1.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_33b0);
          }
          std::ofstream::~ofstream(local_3218);
LAB_001b930d:
          pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          std::__cxx11::string::operator=((string *)&pPVar6->CurrentTag,(string *)&tctime);
          testingDir.field_2._12_4_ = 0;
        }
        std::__cxx11::string::~string((string *)&tctime);
        std::ifstream::~ifstream((void *)((long)&tag.field_2 + 8));
        std::__cxx11::string::~string((string *)local_2988);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2940);
        poVar3 = std::operator<<((ostream *)local_2940,"Cannot create directory ");
        poVar3 = std::operator<<(poVar3,(string *)local_2628);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x1e6,pcVar5,false);
        std::__cxx11::string::~string(local_2960);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2940);
        this_local._4_4_ = 0;
        testingDir.field_2._12_4_ = 1;
      }
    }
    std::__cxx11::string::~string((string *)local_2628);
    if (testingDir.field_2._12_4_ != 0) goto LAB_001b93bc;
  }
  this_local._4_4_ = 1;
  testingDir.field_2._12_4_ = 1;
LAB_001b93bc:
  cmMakefile::~cmMakefile((cmMakefile *)local_2450);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf.IsSourceFileTryCompile);
  cmake::~cmake((cmake *)local_1500);
  return this_local._4_4_;
}

Assistant:

int cmCTest::Initialize(const char* binary_dir, cmCTestStartCommand* command)
{
  bool quiet = false;
  if (command && command->ShouldBeQuiet()) {
    quiet = true;
  }

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (!this->Impl->InteractiveDebugMode) {
    this->BlockTestErrorDiagnostics();
  } else {
    cmSystemTools::PutEnv("CTEST_INTERACTIVE_DEBUG_MODE=1");
  }

  this->Impl->BinaryDir = binary_dir;
  cmSystemTools::ConvertToUnixSlashes(this->Impl->BinaryDir);

  this->UpdateCTestConfiguration();

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (this->Impl->ProduceXML) {
    cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
    cmCTestOptionalLog(this, OUTPUT,
                       "   Site: "
                         << this->GetCTestConfiguration("Site") << std::endl
                         << "   Build name: "
                         << cmCTest::SafeBuildIdField(
                              this->GetCTestConfiguration("BuildName"))
                         << std::endl,
                       quiet);
    cmCTestOptionalLog(this, DEBUG, "Produce XML is on" << std::endl, quiet);
    if (this->Impl->TestModel == cmCTest::NIGHTLY &&
        this->GetCTestConfiguration("NightlyStartTime").empty()) {
      cmCTestOptionalLog(
        this, WARNING,
        "WARNING: No nightly start time found please set in CTestConfig.cmake"
        " or DartConfig.cmake"
          << std::endl,
        quiet);
      cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl,
                         quiet);
      return 0;
    }
  }

  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!this->ReadCustomConfigurationFileTree(this->Impl->BinaryDir, &mf)) {
    cmCTestOptionalLog(
      this, DEBUG, "Cannot find custom configuration file tree" << std::endl,
      quiet);
    return 0;
  }

  if (this->Impl->ProduceXML) {
    // Verify "Testing" directory exists:
    //
    std::string testingDir = this->Impl->BinaryDir + "/Testing";
    if (cmSystemTools::FileExists(testingDir)) {
      if (!cmSystemTools::FileIsDirectory(testingDir)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "File " << testingDir
                           << " is in the place of the testing directory"
                           << std::endl);
        return 0;
      }
    } else {
      if (!cmSystemTools::MakeDirectory(testingDir)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Cannot create directory " << testingDir << std::endl);
        return 0;
      }
    }

    // Create new "TAG" file or read existing one:
    //
    bool createNewTag = true;
    if (command) {
      createNewTag = command->ShouldCreateNewTag();
    }

    std::string tagfile = testingDir + "/TAG";
    cmsys::ifstream tfin(tagfile.c_str());
    std::string tag;

    if (createNewTag) {
      time_t tctime = time(nullptr);
      if (this->Impl->TomorrowTag) {
        tctime += (24 * 60 * 60);
      }
      struct tm* lctime = gmtime(&tctime);
      if (tfin && cmSystemTools::GetLineFromStream(tfin, tag)) {
        int year = 0;
        int mon = 0;
        int day = 0;
        int hour = 0;
        int min = 0;
        sscanf(tag.c_str(), "%04d%02d%02d-%02d%02d", &year, &mon, &day, &hour,
               &min);
        if (year != lctime->tm_year + 1900 || mon != lctime->tm_mon + 1 ||
            day != lctime->tm_mday) {
          tag.clear();
        }
        std::string group;
        if (cmSystemTools::GetLineFromStream(tfin, group) &&
            !this->Impl->Parts[PartStart] && !command) {
          this->Impl->SpecificGroup = group;
        }
        std::string model;
        if (cmSystemTools::GetLineFromStream(tfin, model) &&
            !this->Impl->Parts[PartStart] && !command) {
          this->Impl->TestModel = GetTestModelFromString(model);
        }
        tfin.close();
      }
      if (tag.empty() || (nullptr != command) ||
          this->Impl->Parts[PartStart]) {
        cmCTestOptionalLog(
          this, DEBUG,
          "TestModel: " << this->GetTestModelString() << std::endl, quiet);
        cmCTestOptionalLog(this, DEBUG,
                           "TestModel: " << this->Impl->TestModel << std::endl,
                           quiet);
        if (this->Impl->TestModel == cmCTest::NIGHTLY) {
          lctime = this->GetNightlyTime(
            this->GetCTestConfiguration("NightlyStartTime"),
            this->Impl->TomorrowTag);
        }
        char datestring[100];
        snprintf(datestring, sizeof(datestring), "%04d%02d%02d-%02d%02d",
                 lctime->tm_year + 1900, lctime->tm_mon + 1, lctime->tm_mday,
                 lctime->tm_hour, lctime->tm_min);
        tag = datestring;
        cmsys::ofstream ofs(tagfile.c_str());
        if (ofs) {
          ofs << tag << std::endl;
          ofs << this->GetTestModelString() << std::endl;
          switch (this->Impl->TestModel) {
            case cmCTest::EXPERIMENTAL:
              ofs << "Experimental" << std::endl;
              break;
            case cmCTest::NIGHTLY:
              ofs << "Nightly" << std::endl;
              break;
            case cmCTest::CONTINUOUS:
              ofs << "Continuous" << std::endl;
              break;
          }
        }
        ofs.close();
        if (nullptr == command) {
          cmCTestOptionalLog(this, OUTPUT,
                             "Create new tag: " << tag << " - "
                                                << this->GetTestModelString()
                                                << std::endl,
                             quiet);
        }
      }
    } else {
      std::string group;
      std::string modelStr;
      int model = cmCTest::UNKNOWN;

      if (tfin) {
        cmSystemTools::GetLineFromStream(tfin, tag);
        cmSystemTools::GetLineFromStream(tfin, group);
        if (cmSystemTools::GetLineFromStream(tfin, modelStr)) {
          model = GetTestModelFromString(modelStr);
        }
        tfin.close();
      }

      if (tag.empty()) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Cannot read existing TAG file in " << testingDir
                                                       << std::endl);
        return 0;
      }

      if (this->Impl->TestModel == cmCTest::UNKNOWN) {
        if (model == cmCTest::UNKNOWN) {
          cmCTestLog(this, ERROR_MESSAGE,
                     "TAG file does not contain model and "
                     "no model specified in start command"
                       << std::endl);
          return 0;
        }

        this->SetTestModel(model);
      }

      if (model != this->Impl->TestModel && model != cmCTest::UNKNOWN &&
          this->Impl->TestModel != cmCTest::UNKNOWN) {
        cmCTestOptionalLog(this, WARNING,
                           "Model given in TAG does not match "
                           "model given in ctest_start()"
                             << std::endl,
                           quiet);
      }

      if (!this->Impl->SpecificGroup.empty() &&
          group != this->Impl->SpecificGroup) {
        cmCTestOptionalLog(this, WARNING,
                           "Group given in TAG does not match "
                           "group given in ctest_start()"
                             << std::endl,
                           quiet);
      } else {
        this->Impl->SpecificGroup = group;
      }

      cmCTestOptionalLog(this, OUTPUT,
                         "  Use existing tag: " << tag << " - "
                                                << this->GetTestModelString()
                                                << std::endl,
                         quiet);
    }

    this->Impl->CurrentTag = tag;
  }

  return 1;
}